

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O1

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  uint __c;
  char *pcVar4;
  
  if ((optreset != 0) || (*getopt::place == '\0')) {
    optreset = 0;
    if ((___argc <= optind) || (getopt::place = ___argv[optind], *getopt::place != '-')) {
LAB_0018631e:
      getopt::place = "";
      optreset = 0;
      return -1;
    }
    pcVar4 = getopt::place + 1;
    if ((*pcVar4 != '\0') && (getopt::place = getopt::place + 1, *pcVar4 == '-')) {
      optind = optind + 1;
      goto LAB_0018631e;
    }
  }
  pcVar4 = getopt::place + 1;
  cVar1 = *getopt::place;
  __c = (uint)cVar1;
  getopt::place = pcVar4;
  optopt = __c;
  if (__c != 0x3a) {
    pcVar2 = strchr(__shortopts,__c);
    if (pcVar2 != (char *)0x0) {
      if (pcVar2[1] == ':') {
        if (*pcVar4 == '\0') {
          lVar3 = (long)optind;
          optind = optind + 1;
          if (___argc <= optind) {
            getopt::place = "";
            if (*__shortopts == ':') {
              return 0x3a;
            }
            if (opterr == 0) {
              return 0x3f;
            }
            pcVar4 = "option requires an argument -- %c\n";
            goto LAB_00186392;
          }
          pcVar4 = ___argv[lVar3 + 1];
        }
        getopt::place = "";
        optarg = pcVar4;
      }
      else {
        optarg = (char *)0x0;
        if (*pcVar4 != '\0') {
          optarg = (char *)0x0;
          return __c;
        }
      }
      optind = optind + 1;
      return __c;
    }
    if (cVar1 == '-') {
      return -1;
    }
  }
  if (*pcVar4 == '\0') {
    optind = optind + 1;
  }
  if (opterr == 0) {
    return 0x3f;
  }
  if (*__shortopts == ':') {
    return 0x3f;
  }
  pcVar4 = "illegal option -- %c\n";
LAB_00186392:
  printf(pcVar4,(ulong)__c);
  return 0x3f;
}

Assistant:

int getopt(int nargc, char * const nargv[], const char *ostr)
{
	static char *place = EMSG;              /* option letter processing */
	const char *oli;                              /* option letter list index */

	if (optreset || !*place) {              /* update scanning pointer */
		optreset = 0;
		if (optind >= nargc || *(place = nargv[optind]) != '-') {
			place = EMSG;
			return (-1);
		}
		if (place[1] && *++place == '-') {      /* found "--" */
			++optind;
			place = EMSG;
			return (-1);
		}
	}                                       /* option letter okay? */
	if ((optopt = (int)*place++) == (int)':' ||
		!(oli = strchr(ostr, optopt))) {
		/*
		* if the user didn't specify '-' as an option,
		* assume it means -1.
		*/
		if (optopt == (int)'-')
			return (-1);
		if (!*place)
			++optind;
		if (opterr && *ostr != ':')
			(void)printf("illegal option -- %c\n", optopt);
		return (BADCH);
	}
	if (*++oli != ':') {                    /* don't need argument */
		optarg = NULL;
		if (!*place)
			++optind;
	}
	else {                                  /* need an argument */
		if (*place)                     /* no white space */
			optarg = place;
		else if (nargc <= ++optind) {   /* no arg */
			place = EMSG;
			if (*ostr == ':')
				return (BADARG);
			if (opterr)
				(void)printf("option requires an argument -- %c\n", optopt);
			return (BADCH);
		}
		else                            /* white space */
			optarg = nargv[optind];
		place = EMSG;
		++optind;
	}
	return (optopt);                        /* dump back option letter */
}